

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

bool Test_EncoderProducesOriginals
               (WirehairCodec encoder,uint N,uint8_t *block,uint8_t *message,uint blockBytes,
               uint finalBytes)

{
  WirehairResult WVar1;
  int iVar2;
  ostream *poVar3;
  void *in_RCX;
  void *in_RDX;
  uint in_ESI;
  uint in_R8D;
  uint in_R9D;
  uint i;
  WirehairResult encodeResult;
  uint32_t bytesOut;
  uint originalBlockId;
  uint local_40;
  uint uVar4;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar5 = 0;
  do {
    if (in_ESI <= uVar5) {
      return true;
    }
    if (uVar5 == in_ESI - 1) {
      memset(in_RDX,0xee,(ulong)in_R8D);
    }
    uVar4 = 0;
    WVar1 = wirehair_encode((WirehairCodec)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            (uint)((ulong)in_RDX >> 0x20),in_RCX,in_R8D,
                            (uint32_t *)((ulong)uVar5 << 0x20));
    if (WVar1 != Wirehair_Success) {
      poVar3 = std::operator<<((ostream *)&std::cout,"!!! Encode original failed for N = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
      poVar3 = std::operator<<(poVar3,", originalBlockId = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return false;
    }
    if (uVar5 == in_ESI - 1) {
      if (uVar4 != in_R9D) {
        poVar3 = std::operator<<((ostream *)&std::cout,"!!! Encode original wrong length for N = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
        poVar3 = std::operator<<(poVar3,", originalBlockId = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
        poVar3 = std::operator<<(poVar3,", bytesOut = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
        poVar3 = std::operator<<(poVar3,", finalBytes = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R9D);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return false;
      }
      iVar2 = memcmp((void *)((long)in_RCX + (ulong)(uVar5 * in_R8D)),in_RDX,(ulong)uVar4);
      local_40 = in_R9D;
      if (iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"!!! Encode original wrong data for N = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
        poVar3 = std::operator<<(poVar3,", originalBlockId = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
        poVar3 = std::operator<<(poVar3,", bytesOut = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
        poVar3 = std::operator<<(poVar3,", finalBytes = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R9D);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return false;
      }
      for (; local_40 < in_R8D; local_40 = local_40 + 1) {
        if (*(char *)((long)in_RDX + (ulong)local_40) != -0x12) {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "!!! Encode original buffer overrun for N = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
          poVar3 = std::operator<<(poVar3,", originalBlockId = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
          poVar3 = std::operator<<(poVar3,", bytesOut = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
          poVar3 = std::operator<<(poVar3,", finalBytes = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R9D);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          return false;
        }
      }
    }
    else {
      if (uVar4 != in_R8D) {
        poVar3 = std::operator<<((ostream *)&std::cout,"!!! Encode original wrong length for N = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
        poVar3 = std::operator<<(poVar3,", originalBlockId = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
        poVar3 = std::operator<<(poVar3,", bytesOut = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
        poVar3 = std::operator<<(poVar3,", blockBytes = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R8D);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return false;
      }
      iVar2 = memcmp((void *)((long)in_RCX + (ulong)(uVar5 * in_R8D)),in_RDX,(ulong)uVar4);
      if (iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"!!! Encode original wrong data for N = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
        poVar3 = std::operator<<(poVar3,", originalBlockId = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
        poVar3 = std::operator<<(poVar3,", bytesOut = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
        poVar3 = std::operator<<(poVar3,", finalBytes = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R9D);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return false;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static bool Test_EncoderProducesOriginals(
    WirehairCodec encoder,
    unsigned N,
    uint8_t* block,
    uint8_t* message,
    unsigned blockBytes,
    unsigned finalBytes)
{
    for (unsigned originalBlockId = 0; originalBlockId < N; ++originalBlockId)
    {
        if (originalBlockId == N - 1) {
            memset(block, kPadChar, blockBytes);
        }

        uint32_t bytesOut = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, originalBlockId, &block[0], blockBytes, &bytesOut);
        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "!!! Encode original failed for N = " << N << ", originalBlockId = " << originalBlockId << endl;
            return false;
        }

        if (originalBlockId == N - 1)
        {
            if (bytesOut != finalBytes)
            {
                SIAMESE_DEBUG_BREAK();
                cout << "!!! Encode original wrong length for N = " << N
                    << ", originalBlockId = " << originalBlockId
                    << ", bytesOut = " << bytesOut << ", finalBytes = " << finalBytes << endl;
                return false;
            }
            if (0 != memcmp(&message[0] + originalBlockId * blockBytes, &block[0], bytesOut))
            {
                SIAMESE_DEBUG_BREAK();
                cout << "!!! Encode original wrong data for N = " << N
                    << ", originalBlockId = " << originalBlockId
                    << ", bytesOut = " << bytesOut << ", finalBytes = " << finalBytes << endl;
                return false;
            }
            for (unsigned i = finalBytes; i < blockBytes; ++i)
            {
                if (block[i] != kPadChar)
                {
                    SIAMESE_DEBUG_BREAK();
                    cout << "!!! Encode original buffer overrun for N = " << N
                        << ", originalBlockId = " << originalBlockId
                        << ", bytesOut = " << bytesOut << ", finalBytes = " << finalBytes << endl;
                    return false;
                }
            }
        }
        else
        {
            if (bytesOut != blockBytes)
            {
                SIAMESE_DEBUG_BREAK();
                cout << "!!! Encode original wrong length for N = " << N
                    << ", originalBlockId = " << originalBlockId
                    << ", bytesOut = " << bytesOut << ", blockBytes = " << blockBytes << endl;
                return false;
            }
            if (0 != memcmp(&message[0] + originalBlockId * blockBytes, &block[0], bytesOut))
            {
                SIAMESE_DEBUG_BREAK();
                cout << "!!! Encode original wrong data for N = " << N
                    << ", originalBlockId = " << originalBlockId
                    << ", bytesOut = " << bytesOut << ", finalBytes = " << finalBytes << endl;
                return false;
            }
        }
    }

    return true;
}